

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

mat4 * mat4_perspective_projection
                 (mat4 *__return_storage_ptr__,float fov,float aspect,float near,float far)

{
  float fVar1;
  
  fVar1 = tanf(fov * 0.017453292 * 0.5);
  __return_storage_ptr__->m[0] = (1.0 / fVar1) / aspect;
  __return_storage_ptr__->m[1] = 0.0;
  __return_storage_ptr__->m[2] = 0.0;
  __return_storage_ptr__->m[3] = 0.0;
  __return_storage_ptr__->m[4] = 0.0;
  __return_storage_ptr__->m[5] = 1.0 / fVar1;
  __return_storage_ptr__->m[6] = 0.0;
  __return_storage_ptr__->m[7] = 0.0;
  __return_storage_ptr__->m[8] = 0.0;
  __return_storage_ptr__->m[9] = 0.0;
  __return_storage_ptr__->m[10] = (near + far) / (near - far);
  __return_storage_ptr__->m[0xb] = ((far + far) * near) / (near - far);
  __return_storage_ptr__->m[0xc] = 0.0;
  __return_storage_ptr__->m[0xd] = 0.0;
  __return_storage_ptr__->m[0xe] = -1.0;
  __return_storage_ptr__->m[0xf] = 0.0;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_perspective_projection(float fov, float aspect, float near, float far) {
    float f = 1.0f / tanf(fov * DEGREES_PER_RADIAN / 2.0f);
    float denominator = near - far;

    float a = f / aspect;
    float b = f;
    float c = (far + near) / denominator;
    float d = (2.0f * far * near) / denominator;

    return mat4_create(
            a, 0.0f, 0.0f, 0.0f,
            0.0f, b, 0.0f, 0.0f,
            0.0f, 0.0f, c, d,
            0.0f, 0.0f, -1.0f, 0.0f);
}